

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
~BayesianProbitRegressor_FeatureValueWeight(BayesianProbitRegressor_FeatureValueWeight *this)

{
  InternalMetadata *this_00;
  BayesianProbitRegressor_Gaussian *this_01;
  ulong uVar1;
  undefined8 *puVar2;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    if (this != (BayesianProbitRegressor_FeatureValueWeight *)
                _BayesianProbitRegressor_FeatureValueWeight_default_instance_) {
      this_01 = this->featureweight_;
      if (this_01 != (BayesianProbitRegressor_Gaussian *)0x0) {
        BayesianProbitRegressor_Gaussian::~BayesianProbitRegressor_Gaussian(this_01);
      }
      operator_delete(this_01,0x28);
      uVar1 = this_00->ptr_;
    }
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
                (this_00);
    }
  }
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  google::protobuf::internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

BayesianProbitRegressor_FeatureValueWeight::~BayesianProbitRegressor_FeatureValueWeight() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}